

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O2

void __thiscall
QOpenGLTexture::setData
          (QOpenGLTexture *this,int xOffset,int yOffset,int zOffset,int width,int height,int depth,
          int mipLevel,PixelFormat sourceFormat,PixelType sourceType,void *data,
          QOpenGLPixelTransferOptions *options)

{
  QOpenGLTexturePrivate::setData
            ((this->d_ptr).d,xOffset,yOffset,zOffset,width,height,depth,mipLevel,0,1,
             CubeMapPositiveX,sourceFormat,sourceType,data,options);
  return;
}

Assistant:

void QOpenGLTexture::setData(int xOffset, int yOffset, int zOffset,
                             int width, int height, int depth,
                             int mipLevel,
                             PixelFormat sourceFormat, PixelType sourceType,
                             const void *data, const QOpenGLPixelTransferOptions * const options)
{
    Q_D(QOpenGLTexture);
    Q_ASSERT(d->textureId);
    d->setData(xOffset, yOffset, zOffset,
               width, height, depth,
               mipLevel, 0, 1,
               QOpenGLTexture::CubeMapPositiveX, sourceFormat,
               sourceType, data, options);
}